

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT19937.h
# Opt level: O0

void __thiscall Nova::MT19937<float>::MT19937(MT19937<float> *this,uint value)

{
  uint value_local;
  MT19937<float> *this_local;
  
  this->_vptr_MT19937 = (_func_int **)&PTR__MT19937_001a96a8;
  Set_Seed(this,value);
  return;
}

Assistant:

explicit MT19937(const unsigned int value)
    {Set_Seed(value);}